

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

bool kj::_::pollImpl(PromiseNode *node,WaitScope *waitScope,SourceLocation location)

{
  EventLoop *this;
  FiberPool *this_00;
  Event *pEVar1;
  EventPort *pEVar2;
  bool bVar3;
  undefined **ppuVar4;
  nfds_t __nfds;
  Exception *__fds;
  long *in_FS_OFFSET;
  FunctionParam<void_()> func;
  Fault f;
  RootEvent doneEvent;
  
  this = waitScope->loop;
  doneEvent.super_Event.loop = (EventLoop *)(*in_FS_OFFSET + -0x28);
  doneEvent.super_Event.next = (Event *)anon_var_dwarf_4d228;
  doneEvent.super_Event.firing = this == (EventLoop *)in_FS_OFFSET[-5];
  doneEvent.super_Event.prev = (Event **)&DAT_00000005;
  if (!doneEvent.super_Event.firing) {
    doneEvent.super_Event._vptr_Event = (_func_int **)this;
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*,kj::EventLoop*&>&,char_const(&)[37]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x81a,FAILED,"&loop == threadLocalEventLoop",
               "_kjCondition,\"WaitScope not valid for this thread.\"",
               (DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> *)&doneEvent,
               (char (*) [37])"WaitScope not valid for this thread.");
    Debug::Fault::fatal(&f);
  }
  doneEvent.super_Event._vptr_Event = (_func_int **)&waitScope->fiber;
  doneEvent.super_Event.firing = (waitScope->fiber).ptr == (FiberBase *)0x0;
  doneEvent.super_Event.loop = (EventLoop *)&kj::none;
  doneEvent.super_Event.next = (Event *)anon_var_dwarf_4d228;
  doneEvent.super_Event.prev = (Event **)&DAT_00000005;
  if (!doneEvent.super_Event.firing) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::_::FiberBase&>&,kj::None_const&>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x81b,FAILED,"waitScope.fiber == kj::none",
               "_kjCondition,\"poll() is not supported in fibers.\"",
               (DebugComparison<kj::Maybe<kj::_::FiberBase_&>_&,_const_kj::None_&> *)&doneEvent,
               (char (*) [35])"poll() is not supported in fibers.");
    Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)(CONCAT71(f.exception._1_7_,this->running) ^ 1);
  if (this->running != false) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51]>
              ((Fault *)&doneEvent,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x81c,FAILED,"!loop.running",
               "_kjCondition,\"poll() is not allowed from within event callbacks.\"",
               (DebugExpression<bool> *)&f,
               (char (*) [51])"poll() is not allowed from within event callbacks.");
    Debug::Fault::fatal((Fault *)&doneEvent);
  }
  doneEvent.super_Event._vptr_Event = (_func_int **)&PTR___cxa_pure_virtual_006455e8;
  doneEvent.super_Event.loop = anon_unknown_173::currentEventLoop();
  doneEvent.super_Event.next = (Event *)0x0;
  doneEvent.super_Event.prev = (Event **)0x0;
  doneEvent.super_Event.firing = false;
  doneEvent.super_Event.live = 0x1e366381;
  doneEvent.super_Event.location.fileName._0_4_ = location.fileName._0_4_;
  doneEvent.super_Event.location.fileName._4_4_ = location.fileName._4_4_;
  doneEvent.super_Event.location.function._0_4_ = location.function._0_4_;
  doneEvent.super_Event.location.function._4_4_ = location.function._4_4_;
  doneEvent.super_Event.location.lineNumber = location.lineNumber;
  doneEvent.super_Event.location.columnNumber = location.columnNumber;
  ppuVar4 = &PTR_traceEvent_006452e0;
  doneEvent.super_Event._vptr_Event = (_func_int **)&PTR_traceEvent_006452e0;
  doneEvent.fired = false;
  doneEvent.traceAddr = pollImpl;
  __fds = (Exception *)&doneEvent;
  doneEvent.node = node;
  (*(node->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(node);
  this->running = true;
  this_00 = (waitScope->runningStacksPool).ptr;
  f.exception = (Exception *)&doneEvent;
  if (this_00 == (FiberPool *)0x0) {
    if (doneEvent.fired == false) {
      do {
        bVar3 = EventLoop::turn(this);
        if (!bVar3) {
          EventLoop::poll(this,(pollfd *)__fds,__nfds,(int)ppuVar4);
          if ((*(char *)&((f.exception)->context).ptr.disposer == '\0') &&
             (this->head == (Event *)0x0)) {
            (*(node->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(node,0);
            if (this->lastRunnableState != false) {
              pEVar2 = (this->port).ptr;
              if (pEVar2 != (EventPort *)0x0) {
                (*pEVar2->_vptr_EventPort[2])(pEVar2,0);
              }
              this->lastRunnableState = false;
            }
            break;
          }
        }
      } while (*(char *)&((f.exception)->context).ptr.disposer != '\x01');
    }
  }
  else {
    func.space._8_8_ = &f;
    func.space._0_8_ = &PTR_operator___00645570;
    FiberPool::runSynchronously(this_00,func);
  }
  bVar3 = doneEvent.fired;
  if (doneEvent.fired != false) {
    pEVar1 = this->head;
    if (this->lastRunnableState != (pEVar1 != (Event *)0x0)) {
      pEVar2 = (this->port).ptr;
      if (pEVar2 != (EventPort *)0x0) {
        (*pEVar2->_vptr_EventPort[2])(pEVar2,(ulong)(pEVar1 != (Event *)0x0));
      }
      this->lastRunnableState = pEVar1 != (Event *)0x0;
    }
  }
  this->running = false;
  Event::~Event(&doneEvent.super_Event);
  return bVar3;
}

Assistant:

bool pollImpl(_::PromiseNode& node, WaitScope& waitScope, SourceLocation location) {
  EventLoop& loop = waitScope.loop;
  KJ_REQUIRE(&loop == threadLocalEventLoop, "WaitScope not valid for this thread.");
  KJ_REQUIRE(waitScope.fiber == kj::none, "poll() is not supported in fibers.");
  KJ_REQUIRE(!loop.running, "poll() is not allowed from within event callbacks.");

  RootEvent doneEvent(&node, reinterpret_cast<void*>(&pollImpl), location);
  node.onReady(&doneEvent);

  loop.running = true;
  KJ_DEFER(loop.running = false);

  waitScope.runOnStackPool([&]() {
    while (!doneEvent.fired) {
      if (!loop.turn()) {
        // No events in the queue.  Poll for I/O.
        loop.poll();

        if (!doneEvent.fired && !loop.isRunnable()) {
          // No progress. Give up.
          node.onReady(nullptr);
          loop.setRunnable(false);
          break;
        }
      }
    }
  });

  if (!doneEvent.fired) {
    return false;
  }

  loop.setRunnable(loop.isRunnable());
  return true;
}